

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.cc
# Opt level: O0

void test_85(QPDF *pdf,char *arg2)

{
  byte bVar1;
  double num;
  string s;
  uint ui;
  unsigned_long_long uli;
  int i;
  longlong li;
  string local_1b0 [6];
  bool b;
  string local_190 [8];
  QPDFObjectHandle oh_ii;
  string local_178 [32];
  string local_158 [8];
  QPDFObjectHandle oh_o;
  string local_140 [32];
  string local_120 [8];
  QPDFObjectHandle oh_s;
  string local_108 [32];
  string local_e8 [8];
  QPDFObjectHandle oh_n;
  string local_d0 [32];
  string local_b0 [8];
  QPDFObjectHandle oh_r;
  QPDFObjectHandle oh_i_neg;
  undefined1 local_88 [8];
  QPDFObjectHandle oh_i_minminus;
  undefined1 local_70 [8];
  QPDFObjectHandle oh_i_umaxplus;
  undefined1 local_58 [8];
  QPDFObjectHandle oh_i_maxplus;
  bool local_38 [8];
  QPDFObjectHandle oh_i;
  QPDFObjectHandle oh_b;
  char *arg2_local;
  QPDF *pdf_local;
  
  QPDFObjectHandle::newBool((bool)((char)&oh_i + '\b'));
  QPDFObjectHandle::newInteger((longlong)local_38);
  oh_i_umaxplus.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._4_4_ = 0x7fffffff;
  QIntC::to_longlong<int>
            ((int *)((long)&oh_i_umaxplus.super_BaseHandle.obj.
                            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                            _M_pi + 4));
  QPDFObjectHandle::newInteger((longlong)local_58);
  oh_i_minminus.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._4_4_ = 0xffffffff;
  QIntC::to_longlong<unsigned_int>
            ((uint *)((long)&oh_i_minminus.super_BaseHandle.obj.
                             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                             _M_pi + 4));
  QPDFObjectHandle::newInteger((longlong)local_70);
  oh_i_neg.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._4_4_ = 0x80000000;
  QIntC::to_longlong<int>
            ((int *)((long)&oh_i_neg.super_BaseHandle.obj.
                            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                            _M_pi + 4));
  QPDFObjectHandle::newInteger((longlong)local_88);
  QPDFObjectHandle::newInteger
            ((longlong)
             &oh_r.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_d0,"42.0",
             (allocator<char> *)
             ((long)&oh_n.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
             7));
  QPDFObjectHandle::newReal(local_b0);
  std::__cxx11::string::~string(local_d0);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&oh_n.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
             7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_108,"/Test",
             (allocator<char> *)
             ((long)&oh_s.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
             7));
  QPDFObjectHandle::newName(local_e8);
  std::__cxx11::string::~string(local_108);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&oh_s.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
             7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_140,"/Test",
             (allocator<char> *)
             ((long)&oh_o.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
             7));
  QPDFObjectHandle::newString(local_120);
  std::__cxx11::string::~string(local_140);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&oh_o.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
             7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_178,"/Test",
             (allocator<char> *)
             ((long)&oh_ii.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
             7));
  QPDFObjectHandle::newOperator(local_158);
  std::__cxx11::string::~string(local_178);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&oh_ii.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
             7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_1b0,"/Test",(allocator<char> *)((long)&li + 7));
  QPDFObjectHandle::newInlineImage(local_190);
  std::__cxx11::string::~string(local_1b0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&li + 7));
  li._6_1_ = 1;
  bVar1 = QPDFObjectHandle::getValueAsBool
                    ((bool *)&oh_i.super_BaseHandle.obj.
                              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                    );
  if ((bVar1 & 1) == 0) {
    __assert_fail("oh_b.getValueAsBool(b)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xbc2,"void test_85(QPDF &, const char *)");
  }
  if (((li._6_1_ ^ 0xff) & 1) == 0) {
    __assert_fail("!b",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xbc3,"void test_85(QPDF &, const char *)");
  }
  bVar1 = QPDFObjectHandle::getValueAsBool(local_38);
  if (((bVar1 ^ 0xff) & 1) == 0) {
    __assert_fail("!oh_i.getValueAsBool(b)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xbc4,"void test_85(QPDF &, const char *)");
  }
  if (((li._6_1_ ^ 0xff) & 1) != 0) {
    bVar1 = QPDFObjectHandle::getValueAsInt((longlong *)local_38);
    if ((bVar1 & 1) != 0) {
      __assert_fail("li == 1LL",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                    ,0xbc8,"void test_85(QPDF &, const char *)");
    }
    __assert_fail("oh_i.getValueAsInt(li)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xbc7,"void test_85(QPDF &, const char *)");
  }
  __assert_fail("!b",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                ,0xbc5,"void test_85(QPDF &, const char *)");
}

Assistant:

static void
test_85(QPDF& pdf, char const* arg2)
{
    // Test QPDFObjectHandle::getValueAs... accessors

    auto oh_b = QPDFObjectHandle::newBool(false);
    auto oh_i = QPDFObjectHandle::newInteger(1);
    auto oh_i_maxplus = QPDFObjectHandle::newInteger(QIntC::to_longlong(INT_MAX) + 1LL);
    auto oh_i_umaxplus = QPDFObjectHandle::newInteger(QIntC::to_longlong(UINT_MAX) + 1LL);
    auto oh_i_minminus = QPDFObjectHandle::newInteger(QIntC::to_longlong(INT_MIN) - 1LL);
    auto oh_i_neg = QPDFObjectHandle::newInteger(-1);
    auto oh_r = QPDFObjectHandle::newReal("42.0");
    auto oh_n = QPDFObjectHandle::newName("/Test");
    auto oh_s = QPDFObjectHandle::newString("/Test");
    auto oh_o = QPDFObjectHandle::newOperator("/Test");
    auto oh_ii = QPDFObjectHandle::newInlineImage("/Test");

    bool b = true;
    assert(oh_b.getValueAsBool(b));
    assert(!b);
    assert(!oh_i.getValueAsBool(b));
    assert(!b);
    long long li = 0LL;
    assert(oh_i.getValueAsInt(li));
    assert(li == 1LL);
    assert(!oh_b.getValueAsInt(li));
    assert(li == 1LL);
    int i = 0;
    assert(oh_i.getValueAsInt(i));
    assert(i == 1);
    assert(!oh_b.getValueAsInt(i));
    assert(i == 1);
    assert(oh_i_maxplus.getValueAsInt(i));
    assert(i == INT_MAX);
    assert(oh_i_minminus.getValueAsInt(i));
    assert(i == INT_MIN);
    unsigned long long uli = 0U;
    assert(oh_i.getValueAsUInt(uli));
    assert(uli == 1u);
    assert(!oh_b.getValueAsUInt(uli));
    assert(uli == 1u);
    assert(oh_i_neg.getValueAsUInt(uli));
    assert(uli == 0u);
    unsigned int ui = 0U;
    assert(oh_i.getValueAsUInt(ui));
    assert(ui == 1u);
    assert(!oh_b.getValueAsUInt(ui));
    assert(ui == 1u);
    assert(oh_i_neg.getValueAsUInt(ui));
    assert(ui == 0u);
    assert(oh_i_umaxplus.getValueAsUInt(ui));
    assert(ui == UINT_MAX);
    std::string s = "0";
    assert(oh_r.getValueAsReal(s));
    assert(s == "42.0");
    assert(!oh_i.getValueAsReal(s));
    assert(s == "42.0");
    double num = 0.0;
    assert(oh_i.getValueAsNumber(num));
    assert(((num - 1.0) < 1e-6) && (num - 1.0 > -1e-6));
    assert(oh_r.getValueAsNumber(num));
    assert(((num - 42.0) < 1e-6) && (num - 42.0 > -1e-6));
    assert(!oh_b.getValueAsNumber(num));
    assert(((num - 42.0) < 1e-6) && (num - 42.0 > -1e-6));
    s = "";
    assert(oh_n.getValueAsName(s));
    assert(s == "/Test");
    assert(!oh_r.getValueAsName(s));
    assert(s == "/Test");
    s = "";
    assert(oh_s.getValueAsUTF8(s));
    assert(s == "/Test");
    assert(!oh_r.getValueAsUTF8(s));
    assert(s == "/Test");
    s = "";
    assert(oh_s.getValueAsUTF8(s));
    assert(s == "/Test");
    assert(!oh_r.getValueAsUTF8(s));
    assert(s == "/Test");
    s = "";
    assert(oh_o.getValueAsOperator(s));
    assert(s == "/Test");
    assert(!oh_r.getValueAsOperator(s));
    assert(s == "/Test");
    s = "";
    assert(oh_ii.getValueAsInlineImage(s));
    assert(s == "/Test");
    assert(!oh_r.getValueAsInlineImage(s));
    assert(s == "/Test");
}